

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTApt.cpp
# Opt level: O2

vecIdxTy * __thiscall
Apt::ShortestPath(vecIdxTy *__return_storage_ptr__,Apt *this,size_t _startN,size_t _endN,
                 double _maxLen,double _headingAtStart,double _headingAtEnd)

{
  vecTaxiNodesTy *this_00;
  pointer pTVar1;
  pointer pTVar2;
  pointer puVar3;
  unsigned_long uVar4;
  Apt *pAVar5;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var6;
  TaxiNode *n;
  pointer pTVar7;
  reference pvVar8;
  size_t sVar9;
  size_t sVar10;
  LTError *this_01;
  pointer __dest;
  pointer puVar11;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *p_Var12;
  double dVar13;
  double dVar14;
  size_t updNIdx;
  double local_b0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  size_t local_88;
  Apt *local_80;
  size_t local_78;
  double local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  double local_60;
  double local_58;
  reference local_50;
  double local_48;
  double local_40;
  size_t _startN_local;
  
  if (_startN == _endN) {
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return (vecIdxTy *)
           &__return_storage_ptr__->
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  }
  this_00 = &this->vecTaxiNodes;
  pTVar1 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar7 = (this->vecTaxiNodes).super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl
                .super__Vector_impl_data._M_start; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
    pTVar7->pathLen = INFINITY;
    pTVar7->prevIdx = 0xffffffffffffffff;
    pTVar7->bVisited = false;
  }
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = &__return_storage_ptr__->
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
  local_60 = _headingAtStart;
  local_58 = _headingAtEnd;
  local_48 = _maxLen;
  _startN_local = _startN;
  pvVar8 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at(this_00,_startN);
  local_80 = this;
  local_78 = _endN;
  local_50 = std::vector<TaxiNode,_std::allocator<TaxiNode>_>::at(this_00,_endN);
  pvVar8->pathLen = 0.0;
  pvVar8->prevIdx = 0xfffffffffffffffe;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&_startN_local);
  do {
    pAVar5 = local_80;
    if ((local_a8._M_impl.super__Vector_impl_data._M_start ==
         local_a8._M_impl.super__Vector_impl_data._M_finish) ||
       (local_50->prevIdx != 0xffffffffffffffff)) {
      p_Var12 = local_68;
      if (local_50->prevIdx != 0xffffffffffffffff) {
        if (local_a8._M_impl.super__Vector_impl_data._M_start !=
            local_a8._M_impl.super__Vector_impl_data._M_finish) {
          local_a8._M_impl.super__Vector_impl_data._M_finish =
               local_a8._M_impl.super__Vector_impl_data._M_start;
        }
        for (updNIdx = local_78; updNIdx < 0xfffffffffffffffe;
            updNIdx = (this_00->super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>)._M_impl.
                      super__Vector_impl_data._M_start[updNIdx].prevIdx) {
          if ((ulong)((long)(pAVar5->vecTaxiNodes).
                            super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pAVar5->vecTaxiNodes).
                            super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>._M_impl.
                            super__Vector_impl_data._M_start >> 6) <= updNIdx) {
            this_01 = (LTError *)__cxa_allocate_exception(0x18);
            LTError::LTError(this_01,
                             "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTApt.cpp"
                             ,0x49e,"ShortestPath",logFATAL,"ASSERT FAILED: %s",
                             "nIdx < vecTaxiNodes.size()");
            __cxa_throw(this_01,&LTError::typeinfo,std::logic_error::~logic_error);
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&updNIdx);
        }
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68->_M_impl)->
        _M_impl).super__Vector_impl_data._M_start =
             local_a8._M_impl.super__Vector_impl_data._M_start;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68->_M_impl)->
        _M_impl).super__Vector_impl_data._M_finish =
             local_a8._M_impl.super__Vector_impl_data._M_finish;
        (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68->_M_impl)->
        _M_impl).super__Vector_impl_data._M_end_of_storage =
             local_a8._M_impl.super__Vector_impl_data._M_end_of_storage;
        p_Var12 = &local_a8;
      }
      p_Var6 = local_68;
      (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var12->_M_impl)->_M_impl).
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var12->_M_impl)->_M_impl).
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&p_Var12->_M_impl)->_M_impl).
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_a8);
      return (vecIdxTy *)p_Var6;
    }
    pTVar7 = (this_00->super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = local_a8._M_impl.super__Vector_impl_data._M_start;
    puVar11 = local_a8._M_impl.super__Vector_impl_data._M_start;
    dVar14 = pTVar7[*local_a8._M_impl.super__Vector_impl_data._M_start].pathLen;
    while (local_70 = dVar14, __dest = puVar3, puVar11 = puVar11 + 1,
          puVar11 != local_a8._M_impl.super__Vector_impl_data._M_finish) {
      puVar3 = puVar11;
      dVar14 = pTVar7[*puVar11].pathLen;
      if (local_70 <= pTVar7[*puVar11].pathLen) {
        puVar3 = __dest;
        dVar14 = local_70;
      }
    }
    sVar10 = *__dest;
    local_b0 = local_60;
    local_88 = sVar10;
    if (pTVar7[sVar10].prevIdx < 0xfffffffffffffffe) {
      sVar9 = GetEdgeBetweenNodes(local_80,pTVar7[sVar10].prevIdx,sVar10);
      local_b0 = local_60;
      if (sVar9 != 0xffffffffffffffff) {
        pTVar2 = (local_80->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        local_b0 = pTVar2[sVar9].angle;
        if (pTVar2[sVar9].a != pTVar7[sVar10].prevIdx) {
          local_b0 = local_b0 + 180.0;
        }
      }
    }
    pTVar7[sVar10].bVisited = true;
    puVar11 = __dest + 1;
    if (puVar11 != local_a8._M_impl.super__Vector_impl_data._M_finish) {
      memmove(__dest,puVar11,
              (long)local_a8._M_impl.super__Vector_impl_data._M_finish - (long)puVar11);
    }
    local_a8._M_impl.super__Vector_impl_data._M_finish =
         local_a8._M_impl.super__Vector_impl_data._M_finish + -1;
    puVar3 = *(pointer *)
              ((long)&pTVar7[sVar10].vecEdges.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8)
    ;
    for (puVar11 = pTVar7[sVar10].vecEdges.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar11 != puVar3; puVar11 = puVar11 + 1) {
      uVar4 = *puVar11;
      pTVar2 = (local_80->vecTaxiEdges).super__Vector_base<TaxiEdge,_std::allocator<TaxiEdge>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pTVar2[uVar4].type - RUN_WAY < 2) {
        sVar10 = pTVar2[uVar4].a;
        if (sVar10 == local_88) {
          sVar10 = pTVar2[uVar4].b;
        }
        pTVar7 = (this_00->super__Vector_base<TaxiNode,_std::allocator<TaxiNode>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        updNIdx = sVar10;
        if (pTVar7[sVar10].bVisited == false) {
          dVar14 = pTVar2[uVar4].angle;
          if (pTVar2[uVar4].a != local_88) {
            dVar14 = pTVar2[uVar4].angle + 180.0;
          }
          if ((((NAN(local_b0)) ||
               (local_40 = dVar14, dVar13 = HeadingDiff(local_b0,dVar14), dVar14 = local_40,
               ABS(dVar13) <= 100.0)) &&
              ((NAN(local_58) ||
               ((updNIdx != local_78 ||
                (dVar14 = HeadingDiff(local_58,dVar14), ABS(dVar14) <= 100.0)))))) &&
             ((dVar14 = pTVar2[uVar4].dist_m + local_70, dVar14 <= local_48 &&
              (dVar14 < pTVar7[sVar10].pathLen)))) {
            pTVar7[sVar10].pathLen = dVar14;
            pTVar7[sVar10].prevIdx = local_88;
            if (updNIdx == local_78) break;
            push_back_unique<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&updNIdx);
          }
        }
      }
    }
  } while( true );
}

Assistant:

vecIdxTy ShortestPath (size_t _startN, size_t _endN, double _maxLen,
                           double _headingAtStart,
                           double _headingAtEnd)
    {
        // Sanity check: _start and _end should differ
        if (_startN == _endN)
            return vecIdxTy();


        // Initialize the Dijkstra values in the nodes array
        for (TaxiNode& n: vecTaxiNodes)
            n.InitDijkstraAttr();

        // This array stores nodes we need to visit
        // (have an initial distance, but aren't fully visited yet)
        vecIdxTy vecVisit;

        // The start place is the given taxiway node
        TaxiNode& startN = vecTaxiNodes.at(_startN);
        const TaxiNode& endN   = vecTaxiNodes.at(_endN);
        startN.pathLen = 0.0;
        startN.prevIdx = ULONG_MAX-1;   // we use "ULONG_MAX-1" for saying "is a start node"
        vecVisit.push_back(_startN);

        // General heading between start and end (reversed)
        // defines first heading (how we leave _startN) and
        // how far the plane is allowed to turn
        
        // outer loop controls currently visited node and checks if end already found
        while (!vecVisit.empty() && endN.prevIdx == ULONG_MAX)
        {
            // fetch node with shortest yet known distance
            // (this isn't awfully efficient, but keeping a separate map or prio-queue
            //  sorted while updating nodes in the next loop
            //  is not simple either. I expect vecVisit to stay short
            //  due to cut-off at _maxLen, so I've decided this way:)
            vecIdxTy::iterator shortestIter = vecVisit.begin();
            double shortestDist = vecTaxiNodes[*shortestIter].pathLen;
            for (vecIdxTy::iterator i = std::next(shortestIter);
                 i != vecVisit.end(); ++i)
            {
                if (vecTaxiNodes[*i].pathLen < shortestDist) {
                    shortestIter = i;
                    shortestDist = vecTaxiNodes[*i].pathLen;
                }
            }
            const size_t shortestNIdx  = *shortestIter;
            TaxiNode& shortestN = vecTaxiNodes[shortestNIdx];
            
            // To avoid too sharp corners we need to know the angle by which we reach this shortest node
            const size_t idxEdgeToShortestN =
            shortestN.prevIdx >= ULONG_MAX-1 ? EDGE_UNKNOWN :
            GetEdgeBetweenNodes(shortestN.prevIdx, shortestNIdx);
            // start heading for when leaving first node, otherwise heading between previous and current node
            const double angleToShortestN =
            idxEdgeToShortestN == EDGE_UNKNOWN ? _headingAtStart :
            vecTaxiEdges[idxEdgeToShortestN].GetAngleFrom(shortestN.prevIdx);
            
            // This one is now already counted as "visited" so no more updates to its pathLen!
            shortestN.bVisited = true;
            vecVisit.erase(shortestIter);

            // Update all connected nodes with best possible distance
            for (size_t eIdx: shortestN.vecEdges)
            {
                const TaxiEdge& e = vecTaxiEdges[eIdx];
                if (!e.isValid()) continue;
                
                size_t updNIdx    = e.otherNode(shortestNIdx);
                TaxiNode& updN    = vecTaxiNodes[updNIdx];
                
                // if aleady visited then no need to re-assess
                if (updN.bVisited)
                    continue;
                
                // Don't allow turns of more than 100°,
                // ie. edge not valid if it would turn more than that
                const double eAngle = e.GetAngleFrom(shortestNIdx);
                if (!std::isnan(angleToShortestN) &&
                    std::abs(HeadingDiff(angleToShortestN,
                                         eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // If the node being analyzed is the end node, then we also
                // need to verify if the heading from end node to actual a/c position
                // would not again cause too sharp a turn:
                if (updNIdx == _endN && !std::isnan(_headingAtEnd) &&
                    std::abs(HeadingDiff(_headingAtEnd, eAngle)) > APT_MAX_PATH_TURN)
                    continue;
                
                // Calculate the yet known best distance to this node
                const double lenToUpd = shortestDist + e.dist_m;
                if (lenToUpd > _maxLen ||               // too far out?
                    updN.pathLen <= lenToUpd)           // node has a faster path already
                    continue;

                // Update this node with new best values
                updN.pathLen = lenToUpd;        // best new known distance
                updN.prevIdx = shortestNIdx;     // predecessor to achieve that distance
                
                // Have we reached the wanted end node?
                if (updNIdx == _endN)
                    break;
                
                // this node is now ready to be visited
                push_back_unique(vecVisit, updNIdx);
            }
        }
        
        // Found nothing? -> return empty list
        if (endN.prevIdx == ULONG_MAX)
            return vecIdxTy();
        
        // put together the nodes from _start through _end in the right order
        vecVisit.clear();
        for (size_t nIdx = _endN;
             nIdx < ULONG_MAX-1;                    // until nIdx becomes invalid
             nIdx = vecTaxiNodes[nIdx].prevIdx)     // move on to _previous_ node on shortest path
        {
            LOG_ASSERT(nIdx < vecTaxiNodes.size());
            vecVisit.push_back(nIdx);
        }
        return vecVisit;
    }